

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

State * __thiscall re2::DFA::WorkqToCachedState(DFA *this,Workq *q,uint flag)

{
  Inst *this_00;
  Prog *pPVar1;
  bool bVar2;
  int *inst;
  int *piVar3;
  ulong uVar4;
  State *pSVar5;
  MatchKind MVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  uint ninst;
  bool bVar12;
  uint uVar13;
  int *piVar14;
  uint local_50;
  
  lVar11 = (long)q->maxmark_ + (long)q->n_;
  iVar10 = (int)lVar11;
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar4 = lVar11 * 4;
  }
  inst = (int *)operator_new__(uVar4);
  if ((q->super_SparseSet).size_ == 0) {
    if (iVar10 < 0) goto LAB_0013b522;
    uVar13 = flag & 0x1000;
    ninst = 0;
    local_50 = 0;
  }
  else {
    piVar3 = (q->super_SparseSet).dense_;
    ninst = 0;
    local_50 = 0;
    bVar12 = false;
    bVar9 = 0;
    piVar14 = piVar3;
    do {
      iVar10 = *piVar14;
      if ((bVar9 & 1) == 0) {
        iVar8 = q->n_;
      }
      else {
        iVar8 = q->n_;
        if ((this->kind_ == kFirstMatch) || (iVar8 <= iVar10)) goto LAB_0013b3fe;
      }
      if (iVar10 < iVar8) {
        this_00 = this->prog_->inst_ + iVar10;
        if (((this_00->out_opcode_ & 7) == 1) && (MVar6 = this->kind_, MVar6 != kManyMatch)) {
          if (MVar6 == kFirstMatch) {
            if ((piVar14 != piVar3) || (bVar2 = Prog::Inst::greedy(this_00,this->prog_), !bVar2))
            goto LAB_0013b39e;
            MVar6 = this->kind_;
          }
          if (MVar6 == kLongestMatch) {
            if ((flag >> 0xc & 1) != 0 && !bVar12) {
LAB_0013b51a:
              pSVar5 = (State *)0x2;
              goto LAB_0013b500;
            }
          }
          else if ((flag >> 0xc & 1) != 0) goto LAB_0013b51a;
        }
LAB_0013b39e:
        pPVar1 = this->prog_;
        if ((pPVar1->inst_[(long)iVar10 + -1].out_opcode_ & 8) != 0) {
          lVar11 = (long)(int)ninst;
          ninst = ninst + 1;
          inst[lVar11] = *piVar14;
        }
        uVar7 = this_00->out_opcode_ & 7;
        if (uVar7 == 5) {
          bVar9 = bVar9 | pPVar1->anchor_end_ ^ 1U;
        }
        else if (uVar7 == 4) {
          local_50 = local_50 | (this_00->field_1).out1_;
        }
      }
      else if ((0 < (int)ninst) && (inst[(ulong)ninst - 1] != -1)) {
        inst[ninst] = -1;
        bVar12 = true;
        ninst = ninst + 1;
      }
      piVar14 = piVar14 + 1;
      piVar3 = (q->super_SparseSet).dense_;
    } while (piVar14 != piVar3 + (q->super_SparseSet).size_);
    iVar8 = q->n_;
LAB_0013b3fe:
    if (iVar8 + q->maxmark_ < (int)ninst) {
LAB_0013b522:
      __assert_fail("(n) <= (q->size())",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                    0x295,"DFA::State *re2::DFA::WorkqToCachedState(Workq *, uint)");
    }
    if (0 < (int)ninst) {
      ninst = ninst - (inst[(ulong)ninst - 1] == -1);
    }
    uVar13 = flag & 0x1000;
    if (local_50 != 0) {
      uVar13 = flag;
    }
    local_50 = local_50 << 0x10;
  }
  if (ninst == 0 && uVar13 == 0) {
    pSVar5 = (State *)0x1;
  }
  else {
    if ((this->kind_ == kLongestMatch) && (0 < (int)ninst)) {
      piVar3 = inst;
      piVar14 = inst;
LAB_0013b47e:
      do {
        iVar10 = *piVar3;
        if (iVar10 != -1) {
          piVar3 = piVar3 + 1;
          if (piVar3 < inst + (int)ninst) goto LAB_0013b47e;
        }
        if (piVar14 != piVar3) {
          uVar4 = (long)piVar3 - (long)piVar14 >> 2;
          lVar11 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar14,piVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar14,piVar3);
        }
        piVar3 = piVar3 + (iVar10 == -1);
        piVar14 = piVar3;
      } while (piVar3 < inst + (int)ninst);
    }
    pSVar5 = CachedState(this,inst,ninst,uVar13 | local_50);
  }
LAB_0013b500:
  operator_delete__(inst);
  return pSVar5;
}

Assistant:

DFA::State* DFA::WorkqToCachedState(Workq* q, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Construct array of instruction ids for the new state.
  // Only ByteRange, EmptyWidth, and Match instructions are useful to keep:
  // those are the only operators with any effect in
  // RunWorkqOnEmptyString or RunWorkqOnByte.
  int* inst = new int[q->size()];
  int n = 0;
  uint needflags = 0;     // flags needed by kInstEmptyWidth instructions
  bool sawmatch = false;  // whether queue contains guaranteed kInstMatch
  bool sawmark = false;  // whether queue contains a Mark
  if (DebugDFA)
    fprintf(stderr, "WorkqToCachedState %s [%#x]", DumpWorkq(q).c_str(), flag);
  for (Workq::iterator it = q->begin(); it != q->end(); ++it) {
    int id = *it;
    if (sawmatch && (kind_ == Prog::kFirstMatch || q->is_mark(id)))
      break;
    if (q->is_mark(id)) {
      if (n > 0 && inst[n-1] != Mark) {
        sawmark = true;
        inst[n++] = Mark;
      }
      continue;
    }
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      case kInstAltMatch:
        // This state will continue to a match no matter what
        // the rest of the input is.  If it is the highest priority match
        // being considered, return the special FullMatchState
        // to indicate that it's all matches from here out.
        if (kind_ != Prog::kManyMatch &&
            (kind_ != Prog::kFirstMatch ||
             (it == q->begin() && ip->greedy(prog_))) &&
            (kind_ != Prog::kLongestMatch || !sawmark) &&
            (flag & kFlagMatch)) {
          delete[] inst;
          if (DebugDFA)
            fprintf(stderr, " -> FullMatchState\n");
          return FullMatchState;
        }
        // Fall through.
      default:
        // Record iff id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        if (prog_->inst(id-1)->last())
          inst[n++] = *it;
        if (ip->opcode() == kInstEmptyWidth)
          needflags |= ip->empty();
        if (ip->opcode() == kInstMatch && !prog_->anchor_end())
          sawmatch = true;
        break;
    }
  }
  DCHECK_LE(n, q->size());
  if (n > 0 && inst[n-1] == Mark)
    n--;

  // If there are no empty-width instructions waiting to execute,
  // then the extra flag bits will not be used, so there is no
  // point in saving them.  (Discarding them reduces the number
  // of distinct states.)
  if (needflags == 0)
    flag &= kFlagMatch;

  // NOTE(rsc): The code above cannot do flag &= needflags,
  // because if the right flags were present to pass the current
  // kInstEmptyWidth instructions, new kInstEmptyWidth instructions
  // might be reached that in turn need different flags.
  // The only sure thing is that if there are no kInstEmptyWidth
  // instructions at all, no flags will be needed.
  // We could do the extra work to figure out the full set of
  // possibly needed flags by exploring past the kInstEmptyWidth
  // instructions, but the check above -- are any flags needed
  // at all? -- handles the most common case.  More fine-grained
  // analysis can only be justified by measurements showing that
  // too many redundant states are being allocated.

  // If there are no Insts in the list, it's a dead state,
  // which is useful to signal with a special pointer so that
  // the execution loop can stop early.  This is only okay
  // if the state is *not* a matching state.
  if (n == 0 && flag == 0) {
    delete[] inst;
    if (DebugDFA)
      fprintf(stderr, " -> DeadState\n");
    return DeadState;
  }

  // If we're in longest match mode, the state is a sequence of
  // unordered state sets separated by Marks.  Sort each set
  // to canonicalize, to reduce the number of distinct sets stored.
  if (kind_ == Prog::kLongestMatch) {
    int* ip = inst;
    int* ep = ip + n;
    while (ip < ep) {
      int* markp = ip;
      while (markp < ep && *markp != Mark)
        markp++;
      sort(ip, markp);
      if (markp < ep)
        markp++;
      ip = markp;
    }
  }

  // Save the needed empty-width flags in the top bits for use later.
  flag |= needflags << kFlagNeedShift;

  State* state = CachedState(inst, n, flag);
  delete[] inst;
  return state;
}